

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrInstanceCreateInfo *value)

{
  pointer *this;
  char *pcVar1;
  bool bVar2;
  ValidateXrFlagsResult VVar3;
  allocator local_629;
  string local_628 [39];
  allocator local_601;
  string local_600 [36];
  uint local_5dc;
  undefined1 local_5d8 [4];
  uint32_t extension;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  enabled_extension_vec;
  string local_5b8 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_598;
  allocator local_579;
  string local_578 [39];
  allocator local_551;
  string local_550 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_530;
  allocator local_511;
  string local_510 [39];
  allocator local_4e9;
  string local_4e8 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_4c8;
  allocator local_4a9;
  string local_4a8 [39];
  allocator local_481;
  string local_480 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_460;
  allocator local_441;
  string local_440 [39];
  allocator local_419;
  string local_418 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_3f8;
  allocator local_3d9;
  string local_3d8 [32];
  string local_3b8 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_398;
  allocator local_379;
  string local_378 [32];
  string local_358 [32];
  ostringstream local_338 [8];
  ostringstream oss_enum;
  allocator local_1b9;
  ValidateXrFlagsResult instance_create_flags_result;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_198;
  allocator local_179;
  string local_178 [32];
  undefined1 local_158 [40];
  string local_130 [8];
  string error_message;
  allocator local_109;
  string local_108 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_e8;
  allocator local_c9;
  string local_c8 [36];
  NextChainResult local_a4;
  value_type local_a0;
  NextChainResult next_result;
  value_type local_8c;
  undefined1 local_88 [8];
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  XrResult xr_result;
  XrInstanceCreateInfo *value_local;
  bool check_pnext_local;
  bool check_members_local;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *objects_info_local;
  string *command_name_local;
  GenValidUsageXrInstanceInfo *instance_info_local;
  
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
  if (value->type != XR_TYPE_INSTANCE_CREATE_INFO) {
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrInstanceCreateInfo",value->type,
               "VUID-XrInstanceCreateInfo-type-type",XR_TYPE_INSTANCE_CREATE_INFO,
               "XR_TYPE_INSTANCE_CREATE_INFO");
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
  }
  if (check_pnext) {
    this = &duplicate_ext_structs.
            super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)this);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &encountered_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)local_88);
    local_8c = XR_TYPE_DEBUG_UTILS_MESSENGER_CREATE_INFO_EXT;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::push_back
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)this,&local_8c);
    local_a0 = XR_TYPE_INSTANCE_CREATE_INFO_ANDROID_KHR;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::push_back
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_a0);
    local_a4 = ValidateNextChain(instance_info,command_name,objects_info,value->next,
                                 (vector<XrStructureType,_std::allocator<XrStructureType>_> *)
                                 &duplicate_ext_structs.
                                  super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (vector<XrStructureType,_std::allocator<XrStructureType>_> *)
                                 local_88,(vector<XrStructureType,_std::allocator<XrStructureType>_>
                                           *)&encountered_structs.
                                              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (local_a4 == NEXT_CHAIN_RESULT_ERROR) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c8,"VUID-XrInstanceCreateInfo-next-next",&local_c9);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_e8,objects_info);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_108,
                 "Invalid structure(s) in \"next\" chain for XrInstanceCreateInfo struct \"next\"",
                 &local_109);
      CoreValidLogMessage(instance_info,(string *)local_c8,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_e8,(string *)local_108);
      std::__cxx11::string::~string(local_108);
      std::allocator<char>::~allocator((allocator<char> *)&local_109);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_e8);
      std::__cxx11::string::~string(local_c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_c9);
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
    }
    else if (local_a4 == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_130,"Multiple structures of the same type(s) in \"next\" chain for ",
                 (allocator *)(local_158 + 0x27));
      std::allocator<char>::~allocator((allocator<char> *)(local_158 + 0x27));
      std::__cxx11::string::operator+=(local_130,"XrInstanceCreateInfo : ");
      StructTypesToString_abi_cxx11_
                ((GenValidUsageXrInstanceInfo *)local_158,
                 (vector<XrStructureType,_std::allocator<XrStructureType>_> *)instance_info);
      std::__cxx11::string::operator+=(local_130,(string *)local_158);
      std::__cxx11::string::~string((string *)local_158);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_178,"VUID-XrInstanceCreateInfo-next-unique",&local_179);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_198,objects_info);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&instance_create_flags_result,
                 "Multiple structures of the same type(s) in \"next\" chain for XrInstanceCreateInfo struct"
                 ,&local_1b9);
      CoreValidLogMessage(instance_info,(string *)local_178,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_198,(string *)&instance_create_flags_result);
      std::__cxx11::string::~string((string *)&instance_create_flags_result);
      std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_198);
      std::__cxx11::string::~string(local_178);
      std::allocator<char>::~allocator((allocator<char> *)&local_179);
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      std::__cxx11::string::~string(local_130);
    }
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::~vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)local_88);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::~vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &encountered_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::~vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  if ((check_members) &&
     (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == XR_SUCCESS)) {
    VVar3 = ValidateXrInstanceCreateFlags(value->createFlags);
    if (VVar3 == VALIDATE_XR_FLAGS_INVALID) {
      std::__cxx11::ostringstream::ostringstream(local_338);
      std::operator<<((ostream *)local_338,
                      "XrInstanceCreateInfo invalid member XrInstanceCreateFlags \"createFlags\" flag value "
                     );
      Uint32ToHexString_abi_cxx11_((uint32_t)local_358);
      std::operator<<((ostream *)local_338,local_358);
      std::__cxx11::string::~string(local_358);
      std::operator<<((ostream *)local_338," contains illegal bit");
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_378,"VUID-XrInstanceCreateInfo-createFlags-parameter",&local_379);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_398,objects_info);
      std::__cxx11::ostringstream::str();
      CoreValidLogMessage(instance_info,(string *)local_378,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_398,local_3b8);
      std::__cxx11::string::~string((string *)local_3b8);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_398);
      std::__cxx11::string::~string(local_378);
      std::allocator<char>::~allocator((allocator<char> *)&local_379);
      instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      std::__cxx11::ostringstream::~ostringstream(local_338);
    }
    else {
      instance_info_local._4_4_ =
           ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,
                            &value->applicationInfo);
      if (instance_info_local._4_4_ == XR_SUCCESS) {
        if ((value->enabledApiLayerCount == 0) || (value->enabledApiLayerNames != (char **)0x0)) {
          if ((value->enabledApiLayerNames == (char **)0x0) && (value->enabledApiLayerCount != 0)) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_4a8,"VUID-XrInstanceCreateInfo-enabledApiLayerNames-parameter",
                       &local_4a9);
            std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
            vector(&local_4c8,objects_info);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_4e8,
                       "XrInstanceCreateInfo contains invalid NULL for char \"enabledApiLayerNames\" is which not optional since \"enabledApiLayerCount\" is set and must be non-NULL"
                       ,&local_4e9);
            CoreValidLogMessage(instance_info,(string *)local_4a8,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                                command_name,&local_4c8,(string *)local_4e8);
            std::__cxx11::string::~string(local_4e8);
            std::allocator<char>::~allocator((allocator<char> *)&local_4e9);
            std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
            ~vector(&local_4c8);
            std::__cxx11::string::~string(local_4a8);
            std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
            instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
          }
          else if ((value->enabledExtensionCount == 0) ||
                  (value->enabledExtensionNames != (char **)0x0)) {
            if ((value->enabledExtensionNames == (char **)0x0) &&
               (value->enabledExtensionCount != 0)) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_578,"VUID-XrInstanceCreateInfo-enabledExtensionNames-parameter",
                         &local_579);
              std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
              vector(&local_598,objects_info);
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_5b8,
                         "XrInstanceCreateInfo contains invalid NULL for char \"enabledExtensionNames\" is which not optional since \"enabledExtensionCount\" is set and must be non-NULL"
                         ,(allocator *)
                          ((long)&enabled_extension_vec.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
              CoreValidLogMessage(instance_info,(string *)local_578,VALID_USAGE_DEBUG_SEVERITY_ERROR
                                  ,command_name,&local_598,(string *)local_5b8);
              std::__cxx11::string::~string(local_5b8);
              std::allocator<char>::~allocator
                        ((allocator<char> *)
                         ((long)&enabled_extension_vec.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
              std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
              ~vector(&local_598);
              std::__cxx11::string::~string(local_578);
              std::allocator<char>::~allocator((allocator<char> *)&local_579);
              instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
            }
            else {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_5d8);
              for (local_5dc = 0; local_5dc < value->enabledExtensionCount;
                  local_5dc = local_5dc + 1) {
                pcVar1 = value->enabledExtensionNames[local_5dc];
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_600,pcVar1,&local_601);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_5d8,(value_type *)local_600);
                std::__cxx11::string::~string(local_600);
                std::allocator<char>::~allocator((allocator<char> *)&local_601);
              }
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_628,"XrInstanceCreateInfo",&local_629);
              bVar2 = ValidateInstanceExtensionDependencies
                                ((GenValidUsageXrInstanceInfo *)0x0,command_name,(string *)local_628
                                 ,objects_info,
                                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_5d8);
              std::__cxx11::string::~string(local_628);
              std::allocator<char>::~allocator((allocator<char> *)&local_629);
              if (((bVar2 ^ 0xffU) & 1) != 0) {
                instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_5d8);
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_510,"VUID-XrInstanceCreateInfo-enabledExtensionNames-parameter",
                       &local_511);
            std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
            vector(&local_530,objects_info);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_550,
                       "Structure XrInstanceCreateInfo member enabledExtensionCount is NULL, but value->enabledExtensionCount is greater than 0"
                       ,&local_551);
            CoreValidLogMessage(instance_info,(string *)local_510,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                                command_name,&local_530,(string *)local_550);
            std::__cxx11::string::~string(local_550);
            std::allocator<char>::~allocator((allocator<char> *)&local_551);
            std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
            ~vector(&local_530);
            std::__cxx11::string::~string(local_510);
            std::allocator<char>::~allocator((allocator<char> *)&local_511);
            instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_440,"VUID-XrInstanceCreateInfo-enabledApiLayerNames-parameter",&local_441
                    );
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    (&local_460,objects_info);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_480,
                     "Structure XrInstanceCreateInfo member enabledApiLayerCount is NULL, but value->enabledApiLayerCount is greater than 0"
                     ,&local_481);
          CoreValidLogMessage(instance_info,(string *)local_440,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                              command_name,&local_460,(string *)local_480);
          std::__cxx11::string::~string(local_480);
          std::allocator<char>::~allocator((allocator<char> *)&local_481);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
          ~vector(&local_460);
          std::__cxx11::string::~string(local_440);
          std::allocator<char>::~allocator((allocator<char> *)&local_441);
          instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_3d8,"VUID-XrInstanceCreateInfo-applicationInfo-parameter",&local_3d9);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_3f8,objects_info);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_418,"Structure XrInstanceCreateInfo member applicationInfo is invalid",
                   &local_419);
        CoreValidLogMessage(instance_info,(string *)local_3d8,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            command_name,&local_3f8,(string *)local_418);
        std::__cxx11::string::~string(local_418);
        std::allocator<char>::~allocator((allocator<char> *)&local_419);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                  (&local_3f8);
        std::__cxx11::string::~string(local_3d8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
      }
    }
  }
  else {
    instance_info_local._4_4_ =
         valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  }
  return instance_info_local._4_4_;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrInstanceCreateInfo* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_INSTANCE_CREATE_INFO) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrInstanceCreateInfo",
                             value->type, "VUID-XrInstanceCreateInfo-type-type", XR_TYPE_INSTANCE_CREATE_INFO, "XR_TYPE_INSTANCE_CREATE_INFO");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        valid_ext_structs.push_back(XR_TYPE_DEBUG_UTILS_MESSENGER_CREATE_INFO_EXT);
        valid_ext_structs.push_back(XR_TYPE_INSTANCE_CREATE_INFO_ANDROID_KHR);
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrInstanceCreateInfo-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrInstanceCreateInfo struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrInstanceCreateInfo : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrInstanceCreateInfo-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrInstanceCreateInfo struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    ValidateXrFlagsResult instance_create_flags_result = ValidateXrInstanceCreateFlags(value->createFlags);
    // Valid flags available, so it must be invalid to fail.
    if (VALIDATE_XR_FLAGS_INVALID == instance_create_flags_result) {
        // Otherwise, flags must be valid.
        std::ostringstream oss_enum;
        oss_enum << "XrInstanceCreateInfo invalid member XrInstanceCreateFlags \"createFlags\" flag value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->createFlags));
        oss_enum <<" contains illegal bit";
        CoreValidLogMessage(instance_info, "VUID-XrInstanceCreateInfo-createFlags-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Validate that the structure XrApplicationInfo is valid
    xr_result = ValidateXrStruct(instance_info, command_name, objects_info,
                                                     check_members, true, &value->applicationInfo);
    if (XR_SUCCESS != xr_result) {
        CoreValidLogMessage(instance_info, "VUID-XrInstanceCreateInfo-applicationInfo-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrInstanceCreateInfo member applicationInfo is invalid");
        return xr_result;
    }
    // Optional array must be non-NULL when value->enabledApiLayerCount is non-zero
    if (0 != value->enabledApiLayerCount && nullptr == value->enabledApiLayerNames) {
        CoreValidLogMessage(instance_info, "VUID-XrInstanceCreateInfo-enabledApiLayerNames-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrInstanceCreateInfo member enabledApiLayerCount is NULL, but value->enabledApiLayerCount is greater than 0");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Pointer/array variable with a length variable.  Make sure that
    // if length variable is non-zero that the pointer is not NULL
    if (nullptr == value->enabledApiLayerNames && 0 != value->enabledApiLayerCount) {
        CoreValidLogMessage(instance_info, "VUID-XrInstanceCreateInfo-enabledApiLayerNames-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name, objects_info,
                            "XrInstanceCreateInfo contains invalid NULL for char \"enabledApiLayerNames\" is which not "
                            "optional since \"enabledApiLayerCount\" is set and must be non-NULL");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // NOTE: Can't validate "VUID-XrInstanceCreateInfo-enabledApiLayerNames-parameter" null-termination
    // Optional array must be non-NULL when value->enabledExtensionCount is non-zero
    if (0 != value->enabledExtensionCount && nullptr == value->enabledExtensionNames) {
        CoreValidLogMessage(instance_info, "VUID-XrInstanceCreateInfo-enabledExtensionNames-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrInstanceCreateInfo member enabledExtensionCount is NULL, but value->enabledExtensionCount is greater than 0");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Pointer/array variable with a length variable.  Make sure that
    // if length variable is non-zero that the pointer is not NULL
    if (nullptr == value->enabledExtensionNames && 0 != value->enabledExtensionCount) {
        CoreValidLogMessage(instance_info, "VUID-XrInstanceCreateInfo-enabledExtensionNames-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name, objects_info,
                            "XrInstanceCreateInfo contains invalid NULL for char \"enabledExtensionNames\" is which not "
                            "optional since \"enabledExtensionCount\" is set and must be non-NULL");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // NOTE: Can't validate "VUID-XrInstanceCreateInfo-enabledExtensionNames-parameter" null-termination
    std::vector<std::string> enabled_extension_vec;
    for (uint32_t extension = 0; extension < value->enabledExtensionCount; ++extension) {
        enabled_extension_vec.push_back(value->enabledExtensionNames[extension]);
    }
    if (!ValidateInstanceExtensionDependencies(nullptr, command_name, "XrInstanceCreateInfo",
                                               objects_info, enabled_extension_vec)) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Everything checked out properly
    return xr_result;
}